

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O0

void duckdb_je_background_thread_postfork_child(tsdn_t *tsdn)

{
  background_thread_info_t *pbVar1;
  background_thread_info_t *info_00;
  int ret;
  background_thread_info_t *info;
  uint i_1;
  uint i;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  tsdn_t *in_stack_ffffffffffffffa0;
  atomic_b_t *mutex;
  malloc_mutex_t *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint uStack_38;
  uint local_34;
  
  for (local_34 = 0; local_34 < duckdb_je_max_background_threads; local_34 = local_34 + 1) {
    duckdb_je_malloc_mutex_postfork_child
              (in_stack_ffffffffffffffa0,
               (malloc_mutex_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  duckdb_je_malloc_mutex_postfork_child
            (in_stack_ffffffffffffffa0,
             (malloc_mutex_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if ((background_thread_enabled_at_fork & 1U) != 0) {
    malloc_mutex_lock((tsdn_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                      in_stack_ffffffffffffffb0);
    duckdb_je_n_background_threads = 0;
    malloc_mutex_assert_owner
              ((tsdn_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               (malloc_mutex_t *)0x24c5c45);
    mutex = &duckdb_je_background_thread_enabled_state;
    info_00 = (background_thread_info_t *)0x0;
    duckdb_je_background_thread_enabled_state.repr = false;
    for (uStack_38 = 0; pbVar1 = duckdb_je_background_thread_info,
        uStack_38 < duckdb_je_max_background_threads; uStack_38 = uStack_38 + 1) {
      malloc_mutex_lock((tsdn_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                        (malloc_mutex_t *)info_00);
      pbVar1[uStack_38].state = background_thread_stopped;
      in_stack_ffffffffffffffbc = func_0x001d3440(&pbVar1[uStack_38].cond,0);
      background_thread_info_init
                ((tsdn_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),info_00);
      malloc_mutex_unlock((tsdn_t *)info_00,(malloc_mutex_t *)mutex);
    }
    malloc_mutex_unlock((tsdn_t *)info_00,(malloc_mutex_t *)mutex);
  }
  return;
}

Assistant:

void
background_thread_postfork_child(tsdn_t *tsdn) {
	for (unsigned i = 0; i < max_background_threads; i++) {
		malloc_mutex_postfork_child(tsdn,
		    &background_thread_info[i].mtx);
	}
	malloc_mutex_postfork_child(tsdn, &background_thread_lock);
	if (!background_thread_enabled_at_fork) {
		return;
	}

	/* Clear background_thread state (reset to disabled for child). */
	malloc_mutex_lock(tsdn, &background_thread_lock);
	n_background_threads = 0;
	background_thread_enabled_set(tsdn, false);
	for (unsigned i = 0; i < max_background_threads; i++) {
		background_thread_info_t *info = &background_thread_info[i];
		malloc_mutex_lock(tsdn, &info->mtx);
		info->state = background_thread_stopped;
		int ret = pthread_cond_init(&info->cond, NULL);
		assert(ret == 0);
		background_thread_info_init(tsdn, info);
		malloc_mutex_unlock(tsdn, &info->mtx);
	}
	malloc_mutex_unlock(tsdn, &background_thread_lock);
}